

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void __thiscall
amrex::StreamRetry::StreamRetry
          (StreamRetry *this,string *filename,bool abortonretryfailure,int maxtries)

{
  ostream *poVar1;
  undefined4 in_ECX;
  byte in_DL;
  string *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = in_ECX;
  *(byte *)(in_RDI + 2) = in_DL & 1;
  std::__cxx11::string::string((string *)(in_RDI + 4),in_RSI);
  poVar1 = ErrorStream();
  *(ostream **)(in_RDI + 0xc) = poVar1;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x11e8811);
  std::__cxx11::string::string((string *)(in_RDI + 0x12));
  nStreamErrors = 0;
  return;
}

Assistant:

amrex::StreamRetry::StreamRetry(const std::string &filename,
                                 const bool abortonretryfailure,
                                 const int maxtries)
    : tries(0), maxTries(maxtries),
      abortOnRetryFailure(abortonretryfailure),
      fileName(filename),
      sros(amrex::ErrorStream())    // unused here, just to make the compiler happy
{
  nStreamErrors = 0;
}